

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_transaction.cpp
# Opt level: O2

int CfdGetTxInIssuanceInfo
              (void *handle,char *tx_hex_string,uint32_t index,char **entropy,char **nonce,
              int64_t *asset_amount,char **asset_value,int64_t *token_amount,char **token_value,
              char **asset_rangeproof,char **token_rangeproof)

{
  bool bVar1;
  ConfidentialTransaction *this;
  char *pcVar2;
  int64_t iVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  CfdException *this_00;
  Amount AVar7;
  undefined1 local_2b0 [32];
  char *work_asset_rangeproof;
  char *work_token_value;
  char *work_asset_value;
  char *work_nonce;
  char *work_entropy;
  void *local_268;
  undefined8 local_260;
  ConfidentialValue local_258;
  char *local_230;
  char *local_228;
  ConfidentialValue local_220;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_1f8;
  ConfidentialTransactionController ctxc;
  ConfidentialTxInReference ref;
  
  work_entropy = (char *)0x0;
  work_nonce = (char *)0x0;
  work_asset_value = (char *)0x0;
  work_token_value = (char *)0x0;
  work_asset_rangeproof = (char *)0x0;
  local_260 = 0;
  local_268 = handle;
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(tx_hex_string);
  if (!bVar1) {
    std::__cxx11::string::string((string *)&ref,tx_hex_string,(allocator *)&local_258);
    cfd::ConfidentialTransactionController::ConfidentialTransactionController(&ctxc,(string *)&ref);
    std::__cxx11::string::~string((string *)&ref);
    this = cfd::ConfidentialTransactionController::GetTransaction(&ctxc);
    cfd::core::ConfidentialTransaction::GetTxIn(&ref,this,index);
    if (entropy == (char **)0x0) {
      local_228 = (char *)0x0;
    }
    else {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_2b0,
                 &ref.asset_entropy_.data_);
      cfd::core::BlindFactor::BlindFactor((BlindFactor *)&local_220,(ByteData256 *)local_2b0);
      cfd::core::BlindFactor::GetHex_abi_cxx11_((string *)&local_258,(BlindFactor *)&local_220);
      work_entropy = cfd::capi::CreateString((string *)&local_258);
      local_228 = work_entropy;
      std::__cxx11::string::~string((string *)&local_258);
      cfd::core::BlindFactor::~BlindFactor((BlindFactor *)&local_220);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_2b0);
    }
    if (nonce == (char **)0x0) {
      local_230 = (char *)0x0;
    }
    else {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_2b0,
                 &ref.blinding_nonce_.data_);
      cfd::core::BlindFactor::BlindFactor((BlindFactor *)&local_220,(ByteData256 *)local_2b0);
      cfd::core::BlindFactor::GetHex_abi_cxx11_((string *)&local_258,(BlindFactor *)&local_220);
      work_nonce = cfd::capi::CreateString((string *)&local_258);
      local_230 = work_nonce;
      std::__cxx11::string::~string((string *)&local_258);
      cfd::core::BlindFactor::~BlindFactor((BlindFactor *)&local_220);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_2b0);
    }
    cfd::core::ConfidentialValue::ConfidentialValue(&local_258,&ref.issuance_amount_);
    cfd::core::ConfidentialValue::ConfidentialValue(&local_220,&ref.inflation_keys_);
    if (asset_amount != (int64_t *)0x0) {
      bVar1 = cfd::core::ConfidentialValue::HasBlinding(&local_258);
      if (!bVar1) {
        bVar1 = cfd::core::ConfidentialValue::HasBlinding(&local_258);
        if (bVar1) {
          iVar3 = 0;
        }
        else {
          AVar7 = cfd::core::ConfidentialValue::GetAmount(&local_258);
          local_2b0._0_8_ = AVar7.amount_;
          local_2b0[8] = AVar7.ignore_check_;
          iVar3 = cfd::core::Amount::GetSatoshiValue((Amount *)local_2b0);
        }
        *asset_amount = iVar3;
      }
    }
    if (asset_value == (char **)0x0) {
      pcVar2 = (char *)0x0;
    }
    else {
      cfd::core::ConfidentialValue::GetHex_abi_cxx11_((string *)local_2b0,&local_258);
      pcVar2 = cfd::capi::CreateString((string *)local_2b0);
      work_asset_value = pcVar2;
      std::__cxx11::string::~string((string *)local_2b0);
    }
    if (token_amount != (int64_t *)0x0) {
      bVar1 = cfd::core::ConfidentialValue::HasBlinding(&local_220);
      if (!bVar1) {
        bVar1 = cfd::core::ConfidentialValue::HasBlinding(&local_220);
        if (bVar1) {
          iVar3 = 0;
        }
        else {
          AVar7 = cfd::core::ConfidentialValue::GetAmount(&local_220);
          local_2b0._0_8_ = AVar7.amount_;
          local_2b0[8] = AVar7.ignore_check_;
          iVar3 = cfd::core::Amount::GetSatoshiValue((Amount *)local_2b0);
        }
        *token_amount = iVar3;
      }
    }
    if (token_value == (char **)0x0) {
      pcVar4 = (char *)0x0;
    }
    else {
      cfd::core::ConfidentialValue::GetHex_abi_cxx11_((string *)local_2b0,&local_220);
      pcVar4 = cfd::capi::CreateString((string *)local_2b0);
      work_token_value = pcVar4;
      std::__cxx11::string::~string((string *)local_2b0);
    }
    if (asset_rangeproof == (char **)0x0) {
      pcVar5 = (char *)0x0;
    }
    else {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1f8,
                 &ref.issuance_amount_rangeproof_.data_);
      cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_2b0,(ByteData *)&local_1f8);
      pcVar5 = cfd::capi::CreateString((string *)local_2b0);
      work_asset_rangeproof = pcVar5;
      std::__cxx11::string::~string((string *)local_2b0);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_1f8);
    }
    if (token_rangeproof == (char **)0x0) {
      pcVar6 = (char *)0x0;
    }
    else {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1f8,
                 &ref.inflation_keys_rangeproof_.data_);
      cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_2b0,(ByteData *)&local_1f8);
      pcVar6 = cfd::capi::CreateString((string *)local_2b0);
      std::__cxx11::string::~string((string *)local_2b0);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_1f8);
    }
    if (local_228 != (char *)0x0) {
      *entropy = local_228;
    }
    if (local_230 != (char *)0x0) {
      *nonce = local_230;
    }
    if (pcVar2 != (char *)0x0) {
      *asset_value = pcVar2;
    }
    if (pcVar4 != (char *)0x0) {
      *token_value = pcVar4;
    }
    if (pcVar5 != (char *)0x0) {
      *asset_rangeproof = pcVar5;
    }
    if (pcVar6 != (char *)0x0) {
      *token_rangeproof = pcVar6;
    }
    cfd::core::ConfidentialValue::~ConfidentialValue(&local_220);
    cfd::core::ConfidentialValue::~ConfidentialValue(&local_258);
    cfd::core::ConfidentialTxInReference::~ConfidentialTxInReference(&ref);
    cfd::ConfidentialTransactionController::~ConfidentialTransactionController(&ctxc);
    return 0;
  }
  ref.super_AbstractTxInReference._vptr_AbstractTxInReference = (_func_int **)0x4fbb12;
  ref.super_AbstractTxInReference.txid_._vptr_Txid._0_4_ = 0x259;
  ref.super_AbstractTxInReference.txid_.data_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = "CfdGetTxInIssuanceInfo";
  cfd::core::logger::warn<>((CfdSourceLocation *)&ref,"tx is null or empty.");
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&ref,"Failed to parameter. tx is null or empty.",(allocator *)&ctxc);
  cfd::core::CfdException::CfdException(this_00,kCfdIllegalArgumentError,(string *)&ref);
  __cxa_throw(this_00,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetTxInIssuanceInfo(
    void* handle, const char* tx_hex_string, uint32_t index, char** entropy,
    char** nonce, int64_t* asset_amount, char** asset_value,
    int64_t* token_amount, char** token_value, char** asset_rangeproof,
    char** token_rangeproof) {
  char* work_entropy = nullptr;
  char* work_nonce = nullptr;
  char* work_asset_value = nullptr;
  char* work_token_value = nullptr;
  char* work_asset_rangeproof = nullptr;
  char* work_token_rangeproof = nullptr;
  try {
    cfd::Initialize();
    if (IsEmptyString(tx_hex_string)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }

    ConfidentialTransactionController ctxc(tx_hex_string);
    const ConfidentialTransaction& tx = ctxc.GetTransaction();
    const ConfidentialTxInReference ref = tx.GetTxIn(index);

    if (entropy != nullptr) {
      work_entropy = CreateString(BlindFactor(ref.GetAssetEntropy()).GetHex());
    }
    if (nonce != nullptr) {
      work_nonce = CreateString(BlindFactor(ref.GetBlindingNonce()).GetHex());
    }
    const ConfidentialValue& asset_obj = ref.GetIssuanceAmount();
    const ConfidentialValue& token_obj = ref.GetInflationKeys();
    if ((asset_amount != nullptr) && (!asset_obj.HasBlinding())) {
      *asset_amount = (asset_obj.HasBlinding())
                          ? 0
                          : asset_obj.GetAmount().GetSatoshiValue();
    }
    if (asset_value != nullptr) {
      work_asset_value = CreateString(asset_obj.GetHex());
    }
    if ((token_amount != nullptr) && (!token_obj.HasBlinding())) {
      *token_amount = (token_obj.HasBlinding())
                          ? 0
                          : token_obj.GetAmount().GetSatoshiValue();
    }
    if (token_value != nullptr) {
      work_token_value = CreateString(token_obj.GetHex());
    }
    if (asset_rangeproof != nullptr) {
      work_asset_rangeproof =
          CreateString(ref.GetIssuanceAmountRangeproof().GetHex());
    }
    if (token_rangeproof != nullptr) {
      work_token_rangeproof =
          CreateString(ref.GetInflationKeysRangeproof().GetHex());
    }

    if (work_entropy != nullptr) *entropy = work_entropy;
    if (work_nonce != nullptr) *nonce = work_nonce;
    if (work_asset_value != nullptr) *asset_value = work_asset_value;
    if (work_token_value != nullptr) *token_value = work_token_value;
    if (work_asset_rangeproof != nullptr)
      *asset_rangeproof = work_asset_rangeproof;
    if (work_token_rangeproof != nullptr)
      *token_rangeproof = work_token_rangeproof;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    FreeBufferOnError(
        &work_entropy, &work_nonce, &work_asset_value, &work_token_value,
        &work_asset_rangeproof, &work_token_rangeproof);
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    FreeBufferOnError(
        &work_entropy, &work_nonce, &work_asset_value, &work_token_value,
        &work_asset_rangeproof, &work_token_rangeproof);
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    FreeBufferOnError(
        &work_entropy, &work_nonce, &work_asset_value, &work_token_value,
        &work_asset_rangeproof, &work_token_rangeproof);
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}